

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O0

error_code __thiscall
pstore::exchange::import_ns::fragment_sections::end_object(fragment_sections *this)

{
  bool bVar1;
  context *this_00;
  transaction_base *ptVar2;
  pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  first;
  database *pdVar3;
  element_type *f;
  element_type *this_01;
  uint128 *__x;
  address_patch *this_02;
  error_code eVar4;
  address_patch *local_1e0 [2];
  unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
  *local_1d0;
  __normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  local_1c8;
  __normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  local_1c0;
  pair<pstore::uint128,_pstore::extent<pstore::repo::fragment>_> local_1b8;
  pair<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>::iterator_base<false>,_bool>
  local_198;
  undefined1 local_a0 [8];
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragment_index;
  undefined1 local_80 [24];
  __normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  local_68;
  undefined1 local_60 [8];
  extent<pstore::repo::fragment> fext;
  __normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
  local_48;
  pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  dispatchers_end;
  pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
  dispatchers_begin;
  context *ctxt;
  fragment_sections *this_local;
  error_code error;
  
  this_00 = rule::get_context(&this->super_rule);
  ptVar2 = gsl::not_null<pstore::transaction_base_*>::operator->(&this->transaction_);
  dispatchers_begin.it_._M_current =
       (__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
        )transaction_base::db(ptVar2);
  bVar1 = gsl::not_null<pstore::database_*>::operator==
                    (&this_00->db,(database **)&dispatchers_begin);
  if (bVar1) {
    dispatchers_end.it_._M_current =
         std::
         vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
         ::begin(&this->dispatchers_);
    first = make_pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>
                      (dispatchers_end.it_._M_current);
    fext.size = (uint64_t)
                std::
                vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>
                ::end(&this->dispatchers_);
    local_48._M_current =
         (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          *)make_pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>
                      ((__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>
                        )fext.size);
    ptVar2 = gsl::not_null::operator_cast_to_transaction_base_((not_null *)&this->transaction_);
    local_80._16_8_ = local_48._M_current;
    local_68._M_current =
         (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
          *)first;
    _local_60 = repo::fragment::
                alloc<pstore::transaction_base,pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>>
                          (ptVar2,first,
                           (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                            )local_48._M_current);
    pdVar3 = gsl::not_null::operator_cast_to_database_((not_null *)this_00);
    repo::fragment::load((fragment *)local_80,pdVar3,(extent<pstore::repo::fragment> *)local_60);
    f = std::
        __shared_ptr_access<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator*((__shared_ptr_access<const_pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)local_80);
    eVar4 = check_fragment(f);
    error._0_8_ = eVar4._M_cat;
    this_local._0_4_ = eVar4._M_value;
    std::shared_ptr<const_pstore::repo::fragment>::~shared_ptr
              ((shared_ptr<const_pstore::repo::fragment> *)local_80);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)&this_local);
    if (!bVar1) {
      pdVar3 = gsl::not_null::operator_cast_to_database_((not_null *)this_00);
      pstore::index::
      get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                ((index *)local_a0,pdVar3,true);
      this_01 = std::
                __shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_a0);
      ptVar2 = gsl::not_null::operator_cast_to_transaction_base_((not_null *)&this->transaction_);
      __x = gsl::not_null::operator_cast_to_uint128_((not_null *)&this->digest_);
      std::make_pair<pstore::uint128_const&,pstore::extent<pstore::repo::fragment>const&>
                (&local_1b8,__x,(extent<pstore::repo::fragment> *)local_60);
      pstore::index::
      hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
      ::insert<pstore::uint128,pstore::extent<pstore::repo::fragment>,void>
                (&local_198,
                 (hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                  *)this_01,ptVar2,&local_1b8);
      std::
      pair<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>::iterator_base<false>,_bool>
      ::~pair(&local_198);
      local_1d0 = local_48._M_current;
      local_1c8._M_current =
           (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
            *)first;
      local_1c0._M_current =
           (unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>
            *)std::
              find_if<pstore::pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>*,std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>,std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,std::default_delete<pstore::repo::section_creation_dispatcher>>>>>>,pstore::exchange::import_ns::fragment_sections::end_object()::__0>
                        (first.it_._M_current,local_48._M_current);
      bVar1 = pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
              ::operator!=((pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                            *)&local_1c0,
                           (pointee_adaptor<__gnu_cxx::__normal_iterator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_*,_std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
                            *)&local_48);
      if (bVar1) {
        this_02 = (address_patch *)operator_new(0x20);
        address_patch::address_patch
                  (this_02,(this_00->db).ptr_,(extent<pstore::repo::fragment> *)local_60);
        local_1e0[0] = this_02;
        std::__cxx11::
        list<std::unique_ptr<pstore::exchange::import_ns::patcher,std::default_delete<pstore::exchange::import_ns::patcher>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,std::default_delete<pstore::exchange::import_ns::patcher>>>>
        ::emplace_back<pstore::exchange::import_ns::address_patch*>
                  ((list<std::unique_ptr<pstore::exchange::import_ns::patcher,std::default_delete<pstore::exchange::import_ns::patcher>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::patcher,std::default_delete<pstore::exchange::import_ns::patcher>>>>
                    *)&this_00->patches,local_1e0);
      }
      eVar4 = rule::pop(&this->super_rule);
      error._0_8_ = eVar4._M_cat;
      this_local._0_4_ = eVar4._M_value;
      std::
      shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
      ::~shared_ptr((shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                     *)local_a0);
    }
    eVar4._4_4_ = 0;
    eVar4._M_value = (uint)this_local;
    eVar4._M_cat = (error_category *)error._0_8_;
    return eVar4;
  }
  assert_failed("ctxt->db == &transaction_->db ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/import_fragment.cpp"
                ,0xa5);
}

Assistant:

std::error_code fragment_sections::end_object () {
                context * const ctxt = this->get_context ();
                PSTORE_ASSERT (ctxt->db == &transaction_->db ());

                auto const dispatchers_begin = make_pointee_adaptor (dispatchers_.begin ());
                auto const dispatchers_end = make_pointee_adaptor (dispatchers_.end ());
                auto const fext =
                    repo::fragment::alloc (*transaction_, dispatchers_begin, dispatchers_end);

                // Check that the fragment is legal before we go further.
                if (std::error_code const error =
                        this->check_fragment (*repo::fragment::load (*ctxt->db, fext))) {
                    return error;
                }
                auto const fragment_index =
                    index::get_index<trailer::indices::fragment> (*ctxt->db, true /* create */);
                fragment_index->insert (*transaction_, std::make_pair (*digest_, fext));

                // If this fragment has a linked-definitions section then we need to patch the
                // addresses of the referenced definitions one we've imported everything.
                if (std::find_if (dispatchers_begin, dispatchers_end,
                                  [] (repo::section_creation_dispatcher const & d) {
                                      return d.kind () == repo::section_kind::linked_definitions;
                                  }) != dispatchers_end) {
                    ctxt->patches.emplace_back (new address_patch (ctxt->db, fext));
                }
                return pop ();
            }